

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

bool __thiscall ON_XMLNode::MergeFrom(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNodePrivate *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  wchar_t *pwVar5;
  undefined4 extraout_var_01;
  ON_XMLNode *this_00;
  long *local_d8;
  ON_XMLNode *pLocalChildNode;
  ChildIterator ci;
  ON_XMLNode *pChild;
  undefined1 local_58 [7];
  bool bNeedToMerge;
  PropertyIterator pi;
  ON_XMLProperty *pProperty;
  lock_guard<std::recursive_mutex> local_30;
  lock_guard<std::recursive_mutex> lg2;
  lock_guard<std::recursive_mutex> lg1;
  ON_XMLNode *src_local;
  ON_XMLNode *this_local;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(&lg2,&this->_private->m_mutex);
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_30,&src->_private->m_mutex);
  pOVar1 = this->_private;
  iVar3 = (*src->_vptr_ON_XMLNode[3])();
  bVar2 = ::operator!=(&pOVar1->m_name,(ON_wString *)CONCAT44(extraout_var,iVar3));
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    pi._private = (ON_XMLNodePropertyIteratorPrivate *)0x0;
    (*src->_vptr_ON_XMLNode[0x2d])(local_58,src,0);
    while (pi._private = (ON_XMLNodePropertyIteratorPrivate *)
                         PropertyIterator::GetNextProperty((PropertyIterator *)local_58),
          (ON_XMLProperty *)pi._private != (ON_XMLProperty *)0x0) {
      (*this->_vptr_ON_XMLNode[0xd])(this,pi._private);
    }
    iVar3 = (*this->_vptr_ON_XMLNode[0x22])();
    ci._private = (ON_XMLNodeChildIteratorPrivate *)0x0;
    (*src->_vptr_ON_XMLNode[0x2c])(&pLocalChildNode);
    while (ci._private = (ON_XMLNodeChildIteratorPrivate *)
                         ChildIterator::GetNextChild((ChildIterator *)&pLocalChildNode),
          (ON_XMLNode *)ci._private != (ON_XMLNode *)0x0) {
      if (iVar3 == 0) {
        local_d8 = (long *)0x0;
      }
      else {
        iVar4 = (*((ON_XMLNode *)ci._private)->_vptr_ON_XMLNode[3])();
        pwVar5 = ON_wString::operator_cast_to_wchar_t_
                           ((ON_wString *)CONCAT44(extraout_var_00,iVar4));
        iVar4 = (*this->_vptr_ON_XMLNode[0x29])(this,pwVar5);
        local_d8 = (long *)CONCAT44(extraout_var_01,iVar4);
      }
      if (local_d8 == (long *)0x0) {
        this_00 = (ON_XMLNode *)operator_new(0xe8);
        ON_XMLNode(this_00,(ON_XMLNode *)ci._private);
        (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
      }
      else {
        (**(code **)(*local_d8 + 0x10))(local_d8,ci._private);
      }
    }
    this_local._7_1_ = true;
    ChildIterator::~ChildIterator((ChildIterator *)&pLocalChildNode);
    PropertyIterator::~PropertyIterator((PropertyIterator *)local_58);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_30);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&lg2);
  return this_local._7_1_;
}

Assistant:

bool ON_XMLNode::MergeFrom(const ON_XMLNode& src)
{
  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  if (_private->m_name != src.TagName())
    return false;

  // Copy in the parameters.
  ON_XMLProperty* pProperty = nullptr;

  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    // Replaces any that are already there.
    SetProperty(*pProperty);
  }

  // Copy in the children.
  const auto bNeedToMerge = ChildCount() != 0;

  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    auto* pLocalChildNode = bNeedToMerge ? GetNodeAtPath(pChild->TagName()) : nullptr;
    if (nullptr != pLocalChildNode)
    {
      pLocalChildNode->MergeFrom(*pChild);
    }
    else
    {
      AttachChildNode(new ON_XMLNode(*pChild));
    }
  }

  return true;
}